

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O1

REF_STATUS
ref_gather_scalar_cell_solb(REF_GRID ref_grid,REF_INT ldim,REF_DBL *scalar,char *filename)

{
  REF_MPI ref_mpi;
  bool bVar1;
  uint uVar2;
  REF_STATUS RVar3;
  FILE *__s;
  void *data;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  undefined8 uVar7;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  int iVar11;
  size_t __n;
  REF_INT cell;
  int iVar12;
  REF_NODE pRVar13;
  REF_CELL pRVar14;
  REF_INT part;
  int keyword_code;
  int version;
  REF_LONG ncell_local;
  REF_LONG ncell_recv;
  REF_LONG npri;
  REF_LONG ntet;
  REF_LONG ncell;
  REF_INT ncell_int;
  int dim;
  int code;
  REF_INT nodes [27];
  int local_130;
  REF_INT local_12c;
  REF_NODE local_128;
  int local_11c;
  REF_CELL local_118;
  void *local_110;
  long local_108;
  long local_100;
  double local_f8;
  ulong local_f0;
  REF_DBL *local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  REF_GRID local_c0;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 local_ac;
  REF_INT local_a8 [30];
  
  ref_mpi = ref_grid->mpi;
  pRVar13 = ref_grid->node;
  uVar2 = ref_node_synchronize_globals(pRVar13);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0xc5f,
           "ref_gather_scalar_cell_solb",(ulong)uVar2,"sync");
    return uVar2;
  }
  local_128 = pRVar13;
  local_e8 = scalar;
  uVar2 = ref_cell_ncell(ref_grid->cell[8],pRVar13,&local_d0);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0xc61,
           "ref_gather_scalar_cell_solb",(ulong)uVar2);
    return uVar2;
  }
  uVar2 = ref_cell_ncell(ref_grid->cell[10],local_128,&local_d8);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0xc62,
           "ref_gather_scalar_cell_solb",(ulong)uVar2);
    return uVar2;
  }
  if (local_d8 == 0 && 0 < local_d0) {
    pRVar14 = ref_grid->cell[8];
    iVar11 = 0x42;
  }
  else {
    iVar11 = -1;
    pRVar14 = (REF_CELL)0x0;
  }
  if (0 < local_d8 && local_d0 == 0) {
    pRVar14 = ref_grid->cell[10];
    iVar11 = 0x43;
  }
  if (iVar11 == -1) {
    pcVar10 = "grid must be all tet or all prism";
    uVar7 = 0xc6e;
  }
  else {
    if (ref_grid->mpi->id == 0) {
      __s = fopen(filename,"w");
      if (__s == (FILE *)0x0) {
        printf("unable to open %s\n",filename);
        pcVar10 = "unable to open file";
        uVar7 = 0xc74;
        goto LAB_0017e620;
      }
    }
    else {
      __s = (FILE *)0x0;
    }
    bVar1 = 10000000 < local_d8 + local_d0;
    local_11c = bVar1 + 2;
    local_110 = (void *)((ulong)bVar1 * 4 + 0xc);
    local_f0 = CONCAT44(local_f0._4_4_,iVar11);
    if (ref_mpi->id == 0) {
      local_ac = 1;
      sVar5 = fwrite(&local_ac,4,1,__s);
      if (sVar5 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xc81,"ref_gather_scalar_cell_solb","code",1,sVar5);
        return 1;
      }
      sVar5 = fwrite(&local_11c,4,1,__s);
      if (sVar5 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xc82,"ref_gather_scalar_cell_solb","version",1,sVar5);
        return 1;
      }
      lVar8 = ftell(__s);
      local_12c = 3;
      sVar5 = fwrite(&local_12c,4,1,__s);
      if (sVar5 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xc85,"ref_gather_scalar_cell_solb","dim code",1,sVar5);
        return 1;
      }
      lVar8 = lVar8 + (long)local_110;
      uVar2 = ref_export_meshb_next_position((FILE *)__s,local_11c,lVar8);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xc86,"ref_gather_scalar_cell_solb",(ulong)uVar2,"next p");
        return uVar2;
      }
      local_b0 = 3;
      sVar5 = fwrite(&local_b0,4,1,__s);
      if (sVar5 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xc88,"ref_gather_scalar_cell_solb","dim",1,sVar5);
        return 1;
      }
      lVar4 = ftell(__s);
      if (lVar8 != lVar4) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xc89,"ref_gather_scalar_cell_solb","dim inconsistent",lVar8,lVar4);
        return 1;
      }
    }
    else {
      lVar8 = 0;
    }
    local_100 = 0;
    local_108 = lVar8;
    if (0 < pRVar14->max) {
      iVar11 = 0;
      do {
        RVar3 = ref_cell_nodes(pRVar14,iVar11,local_a8);
        if (RVar3 == 0) {
          uVar2 = ref_cell_part(pRVar14,local_128,iVar11,&local_130);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xc8e,"ref_gather_scalar_cell_solb",(ulong)uVar2,"part");
            return uVar2;
          }
          if (ref_mpi->id == local_130) {
            local_100 = local_100 + 1;
          }
        }
        iVar11 = iVar11 + 1;
      } while (iVar11 < pRVar14->max);
    }
    local_c8 = local_100;
    uVar2 = ref_mpi_allsum(ref_mpi,&local_c8,1,2);
    lVar8 = local_c8;
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0xc94,"ref_gather_scalar_cell_solb",(ulong)uVar2,"sum");
      return uVar2;
    }
    local_118 = pRVar14;
    if (local_c8 < 0x7fffffff) {
      lVar4 = local_108;
      if (ref_mpi->id == 0) {
        lVar4 = ftell(__s);
        local_12c = (REF_INT)local_f0;
        sVar5 = fwrite(&local_12c,4,1,__s);
        if (sVar5 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0xc9d,"ref_gather_scalar_cell_solb","keyword code",1,sVar5);
          return 1;
        }
        lVar4 = (long)local_110 + lVar4 + lVar8 * (ldim * 8) + (long)(ldim * 4) + 4;
        uVar2 = ref_export_meshb_next_position((FILE *)__s,local_11c,lVar4);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0xc9e,"ref_gather_scalar_cell_solb",(ulong)uVar2,"next p");
          return uVar2;
        }
        local_b4 = (undefined4)local_c8;
        sVar5 = fwrite(&local_b4,4,1,__s);
        if (sVar5 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0xca0,"ref_gather_scalar_cell_solb","nnode",1,sVar5);
          return 1;
        }
        local_12c = ldim;
        sVar5 = fwrite(&local_12c,4,1,__s);
        if (sVar5 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0xca2,"ref_gather_scalar_cell_solb","n solutions",1,sVar5);
          return 1;
        }
        local_12c = 1;
        if (0 < ldim) {
          uVar6 = (ulong)(uint)ldim;
          do {
            sVar5 = fwrite(&local_12c,4,1,__s);
            if (sVar5 != 1) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xca5,"ref_gather_scalar_cell_solb","scalar",1,sVar5);
              return 1;
            }
            uVar2 = (int)uVar6 - 1;
            uVar6 = (ulong)uVar2;
          } while (uVar2 != 0);
        }
      }
      local_108 = lVar4;
      if (ref_mpi->id == 0) {
        if (0 < local_118->max) {
          cell = 0;
          pRVar13 = local_128;
          do {
            pRVar14 = local_118;
            RVar3 = ref_cell_nodes(local_118,cell,local_a8);
            local_110 = (void *)CONCAT44(local_110._4_4_,cell);
            if (RVar3 == 0) {
              uVar2 = ref_cell_part(pRVar14,pRVar13,cell,&local_130);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0xcab,"ref_gather_scalar_cell_solb",(ulong)uVar2,"part");
                return uVar2;
              }
              pRVar13 = local_128;
              if (ref_mpi->id == local_130 && 0 < ldim) {
                iVar11 = 0;
                do {
                  iVar12 = local_118->node_per;
                  local_f8 = 0.0;
                  if (0 < (long)iVar12) {
                    lVar8 = 0;
                    do {
                      local_f8 = local_f8 + local_e8[local_a8[lVar8] * ldim + iVar11];
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != lVar8);
                  }
                  local_f8 = local_f8 / (double)iVar12;
                  sVar5 = fwrite(&local_f8,8,1,__s);
                  if (sVar5 != 1) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0xcb2,"ref_gather_scalar_cell_solb","cell avg",1,sVar5);
                    return 1;
                  }
                  iVar11 = iVar11 + 1;
                  pRVar13 = local_128;
                } while (iVar11 != ldim);
              }
            }
            cell = (int)local_110 + 1;
          } while (cell < local_118->max);
        }
        lVar8 = local_108;
        if (1 < ref_mpi->n) {
          local_128 = (REF_NODE)(long)ldim;
          iVar11 = 1;
          RVar3 = 0;
          do {
            uVar2 = ref_mpi_gather_recv(ref_mpi,&local_e0,1,2,iVar11);
            lVar4 = local_e0;
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xcb8,"ref_gather_scalar_cell_solb",(ulong)uVar2,"recv ncell");
              return uVar2;
            }
            if (0 < local_e0) {
              if (local_e0 * (long)local_128 < 0) {
                pcVar10 = "malloc data of REF_DBL negative";
                uVar7 = 0xcba;
                goto LAB_0017df92;
              }
              data = malloc(local_e0 * (long)local_128 * 8);
              if (data == (void *)0x0) {
                pcVar10 = "malloc data of REF_DBL NULL";
                uVar7 = 0xcba;
                goto LAB_0017e620;
              }
              uVar2 = ref_mpi_gather_recv(ref_mpi,data,(int)lVar4 * ldim,3,iVar11);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0xcbd,"ref_gather_scalar_cell_solb",(ulong)uVar2,"send data");
                return uVar2;
              }
              __n = local_e0 * (long)local_128;
              sVar5 = fwrite(data,8,__n,__s);
              if (__n - sVar5 != 0) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0xcc0,"ref_gather_scalar_cell_solb","worker cell avg",__n,sVar5);
                RVar3 = 1;
              }
              if (__n - sVar5 != 0) {
                return RVar3;
              }
              free(data);
              lVar8 = local_108;
            }
            iVar11 = iVar11 + 1;
          } while (iVar11 < ref_mpi->n);
        }
      }
      else {
        uVar2 = ref_mpi_gather_send(ref_mpi,&local_100,1,2);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0xcc6,"ref_gather_scalar_cell_solb",(ulong)uVar2,"send ncell");
          return uVar2;
        }
        lVar8 = local_108;
        if (0 < local_100) {
          lVar8 = local_100 * ldim;
          if (lVar8 < 0) {
            pcVar10 = "malloc data of REF_DBL negative";
            uVar7 = 0xcc8;
            goto LAB_0017df92;
          }
          local_110 = malloc(lVar8 * 8);
          if (local_110 == (void *)0x0) {
            pcVar10 = "malloc data of REF_DBL NULL";
            uVar7 = 0xcc8;
            local_110 = (void *)0x0;
LAB_0017e620:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,uVar7,"ref_gather_scalar_cell_solb",pcVar10);
            return 2;
          }
          local_c0 = ref_grid;
          if (0 < local_118->max) {
            iVar12 = 0;
            iVar11 = 0;
            local_f0 = (ulong)(uint)ldim;
            do {
              pRVar14 = local_118;
              RVar3 = ref_cell_nodes(local_118,iVar12,local_a8);
              if (RVar3 == 0) {
                uVar2 = ref_cell_part(pRVar14,local_128,iVar12,&local_130);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0xccb,"ref_gather_scalar_cell_solb",(ulong)uVar2,"part");
                  return uVar2;
                }
                if (ref_mpi->id == local_130) {
                  if (0 < ldim) {
                    uVar2 = local_118->node_per;
                    uVar6 = 0;
                    do {
                      if ((int)uVar2 < 1) {
                        local_f8 = 0.0;
                      }
                      else {
                        local_f8 = 0.0;
                        uVar9 = 0;
                        do {
                          local_f8 = local_f8 + local_e8[uVar6 + (long)local_a8[uVar9] * (long)ldim]
                          ;
                          uVar9 = uVar9 + 1;
                        } while (uVar2 != uVar9);
                      }
                      local_f8 = local_f8 / (double)(int)uVar2;
                      *(double *)((long)local_110 + uVar6 * 8 + (long)(iVar11 * ldim) * 8) =
                           local_f8;
                      uVar6 = uVar6 + 1;
                    } while (uVar6 != local_f0);
                  }
                  iVar11 = iVar11 + 1;
                }
              }
              iVar12 = iVar12 + 1;
            } while (iVar12 < local_118->max);
          }
          uVar2 = ref_mpi_gather_send(ref_mpi,local_110,ldim * (int)local_100,3);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xcda,"ref_gather_scalar_cell_solb",(ulong)uVar2,"send data");
            return uVar2;
          }
          free(local_110);
          lVar8 = local_108;
          ref_grid = local_c0;
        }
      }
      if ((ref_mpi->id == 0) && (lVar4 = ftell(__s), lVar8 != lVar4)) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xce0,"ref_gather_scalar_cell_solb","solb metric record len inconsistent",lVar8,lVar4
              );
        return 1;
      }
      if (ref_mpi->id == 0) {
        local_12c = 0x36;
        sVar5 = fwrite(&local_12c,4,1,__s);
        if (sVar5 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0xce4,"ref_gather_scalar_cell_solb","end kw",1,sVar5);
          return 1;
        }
        uVar2 = ref_export_meshb_next_position((FILE *)__s,local_11c,0);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0xce6,"ref_gather_scalar_cell_solb",(ulong)uVar2,"next p");
          return uVar2;
        }
      }
      if (ref_grid->mpi->id != 0) {
        return 0;
      }
      fclose(__s);
      return 0;
    }
    pcVar10 = "requires version 4 solb for 64bit ncell";
    uVar7 = 0xc96;
  }
LAB_0017df92:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar7,
         "ref_gather_scalar_cell_solb",pcVar10);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_gather_scalar_cell_solb(REF_GRID ref_grid, REF_INT ldim,
                                               REF_DBL *scalar,
                                               const char *filename) {
  FILE *file;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = NULL;
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_LONG ncell_local, ncell, ntet, npri;
  int version, code, keyword_code, dim, cell_keyword;
  REF_INT i, header_size, ncell_int;
  REF_FILEPOS next_position;
  REF_INT part, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL cell_average, *data;
  REF_INT node, j, proc;
  REF_LONG ncell_recv;

  next_position = 0;

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  RSS(ref_cell_ncell(ref_grid_tet(ref_grid), ref_node, &ntet), "ntet");
  RSS(ref_cell_ncell(ref_grid_pri(ref_grid), ref_node, &npri), "npri");
  cell_keyword = REF_EMPTY;
  if (ntet > 0 && npri == 0) {
    /* GmfSolAtTetrahedra 113 - 47 = 66 */
    cell_keyword = 66;
    ref_cell = ref_grid_tet(ref_grid);
  }
  if (ntet == 0 && npri > 0) {
    /* GmfSolAtTetrahedra 114 - 47 = 67 */
    cell_keyword = 67;
    ref_cell = ref_grid_pri(ref_grid);
  }
  RUS(REF_EMPTY, cell_keyword, "grid must be all tet or all prism");

  file = NULL;
  if (ref_grid_once(ref_grid)) {
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
  }

  if (REF_EXPORT_MESHB_VERTEX_3 < ntet + npri) {
    version = 3;
    header_size = 4 + 8 + 4;
  } else {
    version = 2;
    header_size = 4 + 4 + 4;
  }

  if (ref_mpi_once(ref_mpi)) {
    code = 1;
    REIS(1, fwrite(&code, sizeof(int), 1, file), "code");
    REIS(1, fwrite(&version, sizeof(int), 1, file), "version");
    next_position = (REF_FILEPOS)header_size + ftell(file);
    keyword_code = 3;
    REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "dim code");
    RSS(ref_export_meshb_next_position(file, version, next_position), "next p");
    dim = 3;
    REIS(1, fwrite(&dim, sizeof(int), 1, file), "dim");
    REIS(next_position, ftell(file), "dim inconsistent");
  }

  ncell_local = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
    if (ref_mpi_rank(ref_mpi) == part) {
      ncell_local++;
    }
  }
  ncell = ncell_local;
  RSS(ref_mpi_allsum(ref_mpi, &ncell, 1, REF_LONG_TYPE), "sum");

  RAS(ncell < (REF_LONG)REF_INT_MAX, "requires version 4 solb for 64bit ncell");

  if (ref_mpi_once(ref_mpi)) {
    next_position = (REF_FILEPOS)header_size + (REF_FILEPOS)(4 + (ldim * 4)) +
                    (REF_FILEPOS)ncell * (REF_FILEPOS)(ldim * 8) + ftell(file);
    /* GmfSolAtTetrahedra 113 - 47 = 66 */
    keyword_code = cell_keyword;
    REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "keyword code");
    RSS(ref_export_meshb_next_position(file, version, next_position), "next p");
    ncell_int = (int)ncell;
    REIS(1, fwrite(&ncell_int, sizeof(int), 1, file), "nnode");
    keyword_code = ldim; /* one solution at node */
    REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "n solutions");
    keyword_code = 1; /* solution type 1, scalar */
    for (i = 0; i < ldim; i++) {
      REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "scalar");
    }
  }

  if (ref_mpi_once(ref_mpi)) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part) {
        for (i = 0; i < ldim; i++) {
          cell_average = 0.0;
          for (node = 0; node < ref_cell_node_per(ref_cell); node++)
            cell_average += scalar[i + ldim * nodes[node]];
          cell_average /= (REF_DBL)ref_cell_node_per(ref_cell);
          REIS(1, fwrite(&cell_average, sizeof(REF_DBL), 1, file), "cell avg");
        }
      }
    }
    each_ref_mpi_worker(ref_mpi, proc) {
      RSS(ref_mpi_gather_recv(ref_mpi, &ncell_recv, 1, REF_LONG_TYPE, proc),
          "recv ncell");
      if (ncell_recv > 0) {
        ref_malloc(data, ldim * ncell_recv, REF_DBL);
        RSS(ref_mpi_gather_recv(ref_mpi, data, (REF_INT)(ldim * ncell_recv),
                                REF_DBL_TYPE, proc),
            "send data");
        REIS((size_t)(ldim * ncell_recv),
             fwrite(data, sizeof(REF_DBL), (size_t)(ldim * ncell_recv), file),
             "worker cell avg");
        ref_free(data);
      }
    }
  } else {
    RSS(ref_mpi_gather_send(ref_mpi, &ncell_local, 1, REF_LONG_TYPE),
        "send ncell");
    if (ncell_local > 0) {
      ref_malloc(data, ldim * ncell_local, REF_DBL);
      j = 0;
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
        if (ref_mpi_rank(ref_mpi) == part) {
          for (i = 0; i < ldim; i++) {
            cell_average = 0.0;
            for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
              cell_average += scalar[i + ldim * nodes[node]];
            }
            cell_average /= (REF_DBL)ref_cell_node_per(ref_cell);
            data[i + ldim * j] = cell_average;
          }
          j++;
        }
      }
      RSS(ref_mpi_gather_send(ref_mpi, data, (REF_INT)(ldim * ncell_local),
                              REF_DBL_TYPE),
          "send data");
      ref_free(data);
    }
  }

  if (ref_mpi_once(ref_mpi))
    REIS(next_position, ftell(file), "solb metric record len inconsistent");

  if (ref_mpi_once(ref_mpi)) { /* End */
    keyword_code = 54;
    REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "end kw");
    next_position = 0;
    RSS(ref_export_meshb_next_position(file, version, next_position), "next p");
  }

  if (ref_grid_once(ref_grid)) fclose(file);

  return REF_SUCCESS;
}